

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::Board(Board *this,Board *obj)

{
  Trick *this_00;
  vector<Card,_std::allocator<Card>_> *this_01;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  Trick trick;
  Trick local_50;
  
  p_Var2 = &(this->m_player_hands)._M_t._M_impl.super__Rb_tree_header;
  (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_discard_pile).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_discard_pile).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_discard_pile).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this->m_player_scores)._M_t._M_impl.super__Rb_tree_header;
  (this->m_player_scores)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_player_scores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_player_scores)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_player_scores)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_player_scores)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header;
  (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_player_suited_capabilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_current_trump_suit = 3;
  this->m_player_to_move = obj->m_player_to_move;
  std::vector<Card,_std::allocator<Card>_>::operator=(&this->m_discard_pile,&obj->m_discard_pile);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->m_player_scores)._M_t,&(obj->m_player_scores)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_SuitPlayCapability>,_std::_Select1st<std::pair<const_int,_SuitPlayCapability>_>,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
  ::operator=(&(this->m_player_suited_capabilities)._M_t,&(obj->m_player_suited_capabilities)._M_t);
  this->m_current_trump_suit = obj->m_current_trump_suit;
  if (obj->m_current_trick == (Trick *)0x0) {
    this->m_current_trick = (Trick *)0x0;
  }
  else {
    Trick::Trick(&local_50,obj->m_current_trick);
    this_00 = (Trick *)operator_new(0x20);
    (this_00->m_trick_pile).
    super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_trick_pile).
    super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_trick_pile).
    super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->m_suit_asked = 3;
    this->m_current_trick = this_00;
    std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::operator=
              ((vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_> *)this_00,
               &local_50.m_trick_pile);
    this_00->m_suit_asked = local_50.m_suit_asked;
    this_00->m_trump_suit = local_50.m_trump_suit;
    if ((void *)CONCAT44(local_50.m_trick_pile.
                         super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (_Rb_tree_color)
                         local_50.m_trick_pile.
                         super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_50.m_trick_pile.
                                       super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (_Rb_tree_color)
                                       local_50.m_trick_pile.
                                       super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
    }
  }
  p_Var1 = (obj->m_player_hands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(obj->m_player_hands)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      this_01 = (vector<Card,_std::allocator<Card>_> *)operator_new(0x18);
      (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_01->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<Card,_std::allocator<Card>_>::operator=
                (this_01,(vector<Card,_std::allocator<Card>_> *)p_Var1[1]._M_parent);
      local_50.m_trick_pile.
      super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = p_Var1[1]._M_color;
      local_50.m_trick_pile.
      super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this_01;
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
      ::_M_emplace_unique<std::pair<int,std::vector<Card,std::allocator<Card>>*>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
                  *)this,(pair<int,_std::vector<Card,_std::allocator<Card>_>_*> *)&local_50);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

Board::Board(const Board &obj)
{
    m_player_to_move = obj.m_player_to_move;
    m_discard_pile = obj.m_discard_pile;
    m_player_scores = obj.m_player_scores;
    m_player_suited_capabilities = obj.m_player_suited_capabilities;
    m_current_trump_suit = obj.m_current_trump_suit;
    if(obj.m_current_trick == NULL) {
        m_current_trick = NULL;
    }
    else{
        Trick trick = *obj.m_current_trick;
        m_current_trick = new Trick();
        *m_current_trick = trick;
    }
    for(auto const &pair : obj.m_player_hands) {
        Hand* newHandPointer = new Hand();
        *newHandPointer = *pair.second;
        m_player_hands.insert(std::pair<int, Hand*>(pair.first, newHandPointer));
    }
}